

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int entity6(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  if (tok == 0xf) {
    state_local._4_4_ = 0xb;
  }
  else if (tok == 0x12) {
    state->handler = declClose;
    state->role_none = 0xb;
    state_local._4_4_ = 0x10;
  }
  else {
    state_local._4_4_ = common(state,tok);
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
entity6(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ENTITY_NONE;
  case XML_TOK_NAME:
    state->handler = declClose;
    state->role_none = XML_ROLE_ENTITY_NONE;
    return XML_ROLE_ENTITY_NOTATION_NAME;
  }
  return common(state, tok);
}